

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

ssize_t __thiscall
spdlog::details::file_helper::write(file_helper *this,int __fd,void *__buf,size_t __n)

{
  file_helper *pfVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  os local_68 [32];
  string local_48 [32];
  char *local_28;
  char *data;
  size_t msg_size;
  memory_buf_t *buf_local;
  file_helper *this_local;
  
  msg_size = CONCAT44(in_register_00000034,__fd);
  pfVar1 = this;
  if (this->fd_ != (FILE *)0x0) {
    buf_local = (memory_buf_t *)this;
    data = (char *)fmt::v10::detail::buffer<char>::size((buffer<char> *)msg_size);
    local_28 = fmt::v10::detail::buffer<char>::data((buffer<char> *)msg_size);
    pfVar1 = (file_helper *)fwrite(local_28,1,(size_t)data,(FILE *)this->fd_);
    if (pfVar1 != (file_helper *)data) {
      os::filename_to_str(local_68,&this->filename_);
      std::operator+((char *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Failed writing to file ");
      piVar2 = __errno_location();
      throw_spdlog_ex(local_48,*piVar2);
    }
  }
  return (ssize_t)pfVar1;
}

Assistant:

SPDLOG_INLINE void file_helper::write(const memory_buf_t &buf) {
    if (fd_ == nullptr) return;
    size_t msg_size = buf.size();
    auto data = buf.data();
    if (std::fwrite(data, 1, msg_size, fd_) != msg_size) {
        throw_spdlog_ex("Failed writing to file " + os::filename_to_str(filename_), errno);
    }
}